

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

uint rotateModulo(uint BitWidth,APInt *rotateAmt)

{
  uint uVar1;
  uint64_t uVar2;
  APInt rot;
  APInt AStack_58;
  APInt local_48;
  APInt local_38;
  
  uVar1 = rotateAmt->BitWidth;
  llvm::APInt::APInt(&AStack_58,rotateAmt);
  if (uVar1 < BitWidth) {
    llvm::APInt::zext(&local_48,(uint)rotateAmt);
    llvm::APInt::operator=(&AStack_58,&local_48);
    llvm::APInt::~APInt(&local_48);
  }
  llvm::APInt::APInt(&local_38,AStack_58.BitWidth,(ulong)BitWidth,false);
  llvm::APInt::urem(&local_48,&AStack_58);
  llvm::APInt::operator=(&AStack_58,&local_48);
  llvm::APInt::~APInt(&local_48);
  llvm::APInt::~APInt(&local_38);
  uVar2 = llvm::APInt::getLimitedValue(&AStack_58,(ulong)BitWidth);
  llvm::APInt::~APInt(&AStack_58);
  return (uint)uVar2;
}

Assistant:

static unsigned rotateModulo(unsigned BitWidth, const APInt &rotateAmt) {
  unsigned rotBitWidth = rotateAmt.getBitWidth();
  APInt rot = rotateAmt;
  if (rotBitWidth < BitWidth) {
    // Extend the rotate APInt, so that the urem doesn't divide by 0.
    // e.g. APInt(1, 32) would give APInt(1, 0).
    rot = rotateAmt.zext(BitWidth);
  }
  rot = rot.urem(APInt(rot.getBitWidth(), BitWidth));
  return rot.getLimitedValue(BitWidth);
}